

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O2

int fe_shift_frame(fe_t *fe,int16 *in,int32 len)

{
  ushort *puVar1;
  short sVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  bool bVar8;
  
  sVar2 = fe->frame_shift;
  if (sVar2 < len) {
    len = (int)sVar2;
  }
  iVar6 = (int)fe->frame_size - (int)sVar2;
  lVar7 = (long)iVar6;
  memmove(fe->spch,fe->spch + sVar2,lVar7 * 2);
  memcpy(fe->spch + lVar7,in,(long)len * 2);
  if (fe->swap != '\0') {
    uVar3 = 0;
    lVar5 = lVar7;
    if (0 < len) {
      uVar3 = (ulong)(uint)len;
    }
    while (bVar8 = uVar3 != 0, uVar3 = uVar3 - 1, bVar8) {
      puVar1 = (ushort *)(fe->spch + lVar5);
      *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
      lVar5 = lVar5 + 1;
    }
  }
  if (fe->dither != '\0') {
    uVar3 = 0;
    if (0 < len) {
      uVar3 = (ulong)(uint)len;
    }
    while (bVar8 = uVar3 != 0, uVar3 = uVar3 - 1, bVar8) {
      uVar4 = genrand_int31();
      fe->spch[lVar7] = fe->spch[lVar7] + (ushort)((uVar4 & 3) == 0);
      lVar7 = lVar7 + 1;
    }
  }
  iVar6 = fe_spch_to_frame(fe,iVar6 + len);
  return iVar6;
}

Assistant:

int
fe_shift_frame(fe_t * fe, int16 const *in, int32 len)
{
    int offset, i;

    if (len > fe->frame_shift)
        len = fe->frame_shift;
    offset = fe->frame_size - fe->frame_shift;

    /* Shift data into the raw speech buffer. */
    memmove(fe->spch, fe->spch + fe->frame_shift,
            offset * sizeof(*fe->spch));
    memcpy(fe->spch + offset, in, len * sizeof(*fe->spch));
    /* Swap and dither if necessary. */
    if (fe->swap)
        for (i = 0; i < len; ++i)
            SWAP_INT16(&fe->spch[offset + i]);
    if (fe->dither)
        for (i = 0; i < len; ++i)
            fe->spch[offset + i]
                += (int16) ((!(s3_rand_int31() % 4)) ? 1 : 0);

    return fe_spch_to_frame(fe, offset + len);
}